

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_bind.h
# Opt level: O3

void pybind11::detail::
     vector_modifiers<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>
               (enable_if_t<is_copy_constructible<typename_vector<PerfectMatch>::value_type>::value,_pybind11::class_<std::vector<PerfectMatch>,_std::unique_ptr<std::vector<PerfectMatch>_>_>_>
                *cl)

{
  type local_51;
  arg local_50;
  arg local_40;
  
  local_50.name = "x";
  local_50._8_1_ = 2;
  class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>(std::enable_if<is_copy_constructible<std::vector<PerfectMatch,std::allocator<PerfectMatch>>::value_type>::value,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>::type&)::_lambda(std::vector<PerfectMatch,std::allocator<PerfectMatch>>&,PerfectMatch_const&)_1_,pybind11::arg,char[35]>
            ((class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
              *)cl,"append",(type *)&local_40,&local_50,
             (char (*) [35])"Add an item to the end of the list");
  class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
  ::
  def<pybind11::detail::initimpl::factory<pybind11::detail::vector_modifiers<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>(std::enable_if<is_copy_constructible<std::vector<PerfectMatch,std::allocator<PerfectMatch>>::value_type>::value,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>::type&)::_lambda(pybind11::iterable)_1_,pybind11::detail::void_type(*)(),std::vector<PerfectMatch,std::allocator<PerfectMatch>>*(pybind11::iterable),pybind11::detail::void_type()>::execute<pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>(pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>&)&&::_lambda(pybind11::detail::value_and_holder&,pybind11::iterable)_1_,pybind11::detail::is_new_style_constructor>
            ((class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
              *)cl,"__init__",(type *)&local_50,(is_new_style_constructor *)&local_40);
  class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>(std::enable_if<is_copy_constructible<std::vector<PerfectMatch,std::allocator<PerfectMatch>>::value_type>::value,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>::type&)::_lambda(std::vector<PerfectMatch,std::allocator<PerfectMatch>>&)_1_,char[19]>
            ((class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
              *)cl,"clear",(type *)&local_50,(char (*) [19])"Clear the contents");
  local_50.name = "L";
  local_50._8_1_ = 2;
  class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>(std::enable_if<is_copy_constructible<std::vector<PerfectMatch,std::allocator<PerfectMatch>>::value_type>::value,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>::type&)::_lambda(std::vector<PerfectMatch,std::allocator<PerfectMatch>>&,std::vector<PerfectMatch,std::allocator<PerfectMatch>>const&)_1_,pybind11::arg,char[61]>
            ((class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
              *)cl,"extend",(type *)&local_40,&local_50,
             (char (*) [61])"Extend the list by appending all the items in the given list");
  local_50.name = "L";
  local_50._8_1_ = 2;
  class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>(std::enable_if<is_copy_constructible<std::vector<PerfectMatch,std::allocator<PerfectMatch>>::value_type>::value,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>::type&)::_lambda(std::vector<PerfectMatch,std::allocator<PerfectMatch>>&,pybind11::iterable)_1_,pybind11::arg,char[61]>
            ((class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
              *)cl,"extend",(type *)&local_40,&local_50,
             (char (*) [61])"Extend the list by appending all the items in the given list");
  local_50.name = "i";
  local_50._8_1_ = 2;
  local_40.name = "x";
  local_40._8_1_ = 2;
  class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>(std::enable_if<is_copy_constructible<std::vector<PerfectMatch,std::allocator<PerfectMatch>>::value_type>::value,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>::type&)::_lambda(std::vector<PerfectMatch,std::allocator<PerfectMatch>>&,long,PerfectMatch_const&)_1_,pybind11::arg,pybind11::arg,char[36]>
            ((class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
              *)cl,"insert",&local_51,&local_50,&local_40,
             (char (*) [36])"Insert an item at a given position.");
  class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>(std::enable_if<is_copy_constructible<std::vector<PerfectMatch,std::allocator<PerfectMatch>>::value_type>::value,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>::type&)::_lambda(std::vector<PerfectMatch,std::allocator<PerfectMatch>>&)_2_,char[32]>
            ((class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
              *)cl,"pop",(type *)&local_50,(char (*) [32])"Remove and return the last item");
  local_50.name = "i";
  local_50._8_1_ = 2;
  class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>(std::enable_if<is_copy_constructible<std::vector<PerfectMatch,std::allocator<PerfectMatch>>::value_type>::value,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>::type&)::_lambda(std::vector<PerfectMatch,std::allocator<PerfectMatch>>&,long)_1_,pybind11::arg,char[42]>
            ((class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
              *)cl,"pop",(type *)&local_40,&local_50,
             (char (*) [42])"Remove and return the item at index ``i``");
  class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>(std::enable_if<is_copy_constructible<std::vector<PerfectMatch,std::allocator<PerfectMatch>>::value_type>::value,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>::type&)::_lambda(std::vector<PerfectMatch,std::allocator<PerfectMatch>>&,long,PerfectMatch_const&)_2_>
            ((class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
              *)cl,"__setitem__",(type *)&local_50);
  local_50.name = "s";
  local_50._8_1_ = 2;
  class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>(std::enable_if<is_copy_constructible<std::vector<PerfectMatch,std::allocator<PerfectMatch>>::value_type>::value,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>::type&)::_lambda(std::vector<PerfectMatch,std::allocator<PerfectMatch>>const&,pybind11::slice)_1_,pybind11::arg,char[44]>
            ((class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
              *)cl,"__getitem__",(type *)&local_40,&local_50,
             (char (*) [44])"Retrieve list elements using a slice object");
  class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>(std::enable_if<is_copy_constructible<std::vector<PerfectMatch,std::allocator<PerfectMatch>>::value_type>::value,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>::type&)::_lambda(std::vector<PerfectMatch,std::allocator<PerfectMatch>>&,pybind11::slice,std::vector<PerfectMatch,std::allocator<PerfectMatch>>const&)_1_,char[42]>
            ((class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
              *)cl,"__setitem__",(type *)&local_50,
             (char (*) [42])"Assign list elements using a slice object");
  class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>(std::enable_if<is_copy_constructible<std::vector<PerfectMatch,std::allocator<PerfectMatch>>::value_type>::value,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>::type&)::_lambda(std::vector<PerfectMatch,std::allocator<PerfectMatch>>&,long)_2_,char[40]>
            ((class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
              *)cl,"__delitem__",(type *)&local_50,
             (char (*) [40])"Delete the list elements at index ``i``");
  class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>(std::enable_if<is_copy_constructible<std::vector<PerfectMatch,std::allocator<PerfectMatch>>::value_type>::value,pybind11::class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>::type&)::_lambda(std::vector<PerfectMatch,std::allocator<PerfectMatch>>&,pybind11::slice)_1_,char[42]>
            ((class_<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::unique_ptr<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::default_delete<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>
              *)cl,"__delitem__",(type *)&local_50,
             (char (*) [42])"Delete list elements using a slice object");
  return;
}

Assistant:

void vector_modifiers(enable_if_t<is_copy_constructible<typename Vector::value_type>::value, Class_> &cl) {
    using T = typename Vector::value_type;
    using SizeType = typename Vector::size_type;
    using DiffType = typename Vector::difference_type;

    auto wrap_i = [](DiffType i, SizeType n) {
        if (i < 0)
            i += n;
        if (i < 0 || (SizeType)i >= n)
            throw index_error();
        return i;
    };

    cl.def("append",
           [](Vector &v, const T &value) { v.push_back(value); },
           arg("x"),
           "Add an item to the end of the list");

    cl.def(init([](iterable it) {
        auto v = std::unique_ptr<Vector>(new Vector());
        v->reserve(len_hint(it));
        for (handle h : it)
           v->push_back(h.cast<T>());
        return v.release();
    }));

    cl.def("clear",
        [](Vector &v) {
            v.clear();
        },
        "Clear the contents"
    );

    cl.def("extend",
       [](Vector &v, const Vector &src) {
           v.insert(v.end(), src.begin(), src.end());
       },
       arg("L"),
       "Extend the list by appending all the items in the given list"
    );

    cl.def("extend",
       [](Vector &v, iterable it) {
           const size_t old_size = v.size();
           v.reserve(old_size + len_hint(it));
           try {
               for (handle h : it) {
                   v.push_back(h.cast<T>());
               }
           } catch (const cast_error &) {
               v.erase(v.begin() + static_cast<typename Vector::difference_type>(old_size), v.end());
               try {
                   v.shrink_to_fit();
               } catch (const std::exception &) {
                   // Do nothing
               }
               throw;
           }
       },
       arg("L"),
       "Extend the list by appending all the items in the given list"
    );

    cl.def("insert",
        [](Vector &v, DiffType i, const T &x) {
            // Can't use wrap_i; i == v.size() is OK
            if (i < 0)
                i += v.size();
            if (i < 0 || (SizeType)i > v.size())
                throw index_error();
            v.insert(v.begin() + i, x);
        },
        arg("i") , arg("x"),
        "Insert an item at a given position."
    );

    cl.def("pop",
        [](Vector &v) {
            if (v.empty())
                throw index_error();
            T t = v.back();
            v.pop_back();
            return t;
        },
        "Remove and return the last item"
    );

    cl.def("pop",
        [wrap_i](Vector &v, DiffType i) {
            i = wrap_i(i, v.size());
            T t = v[(SizeType) i];
            v.erase(v.begin() + i);
            return t;
        },
        arg("i"),
        "Remove and return the item at index ``i``"
    );

    cl.def("__setitem__",
        [wrap_i](Vector &v, DiffType i, const T &t) {
            i = wrap_i(i, v.size());
            v[(SizeType)i] = t;
        }
    );

    /// Slicing protocol
    cl.def("__getitem__",
        [](const Vector &v, slice slice) -> Vector * {
            size_t start, stop, step, slicelength;

            if (!slice.compute(v.size(), &start, &stop, &step, &slicelength))
                throw error_already_set();

            auto *seq = new Vector();
            seq->reserve((size_t) slicelength);

            for (size_t i=0; i<slicelength; ++i) {
                seq->push_back(v[start]);
                start += step;
            }
            return seq;
        },
        arg("s"),
        "Retrieve list elements using a slice object"
    );

    cl.def("__setitem__",
        [](Vector &v, slice slice,  const Vector &value) {
            size_t start, stop, step, slicelength;
            if (!slice.compute(v.size(), &start, &stop, &step, &slicelength))
                throw error_already_set();

            if (slicelength != value.size())
                throw std::runtime_error("Left and right hand size of slice assignment have different sizes!");

            for (size_t i=0; i<slicelength; ++i) {
                v[start] = value[i];
                start += step;
            }
        },
        "Assign list elements using a slice object"
    );

    cl.def("__delitem__",
        [wrap_i](Vector &v, DiffType i) {
            i = wrap_i(i, v.size());
            v.erase(v.begin() + i);
        },
        "Delete the list elements at index ``i``"
    );

    cl.def("__delitem__",
        [](Vector &v, slice slice) {
            size_t start, stop, step, slicelength;

            if (!slice.compute(v.size(), &start, &stop, &step, &slicelength))
                throw error_already_set();

            if (step == 1 && false) {
                v.erase(v.begin() + (DiffType) start, v.begin() + DiffType(start + slicelength));
            } else {
                for (size_t i = 0; i < slicelength; ++i) {
                    v.erase(v.begin() + DiffType(start));
                    start += step - 1;
                }
            }
        },
        "Delete list elements using a slice object"
    );

}